

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::GetVarint64Ptr(char *p,char *limit,uint64_t *value)

{
  byte bVar1;
  long lVar2;
  ulong *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  uint64_t byte;
  uint32_t shift;
  uint64_t result;
  uint local_34;
  ulong local_30;
  byte *local_18;
  byte *local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0;
  local_34 = 0;
  local_18 = in_RDI;
  do {
    if (0x3f < local_34 || in_RSI <= local_18) {
      local_10 = (byte *)0x0;
LAB_00d4d613:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return (char *)local_10;
      }
      __stack_chk_fail();
    }
    bVar1 = *local_18;
    local_18 = local_18 + 1;
    if ((bVar1 & 0x80) == 0) {
      *in_RDX = (ulong)bVar1 << ((byte)local_34 & 0x3f) | local_30;
      local_10 = local_18;
      goto LAB_00d4d613;
    }
    local_30 = ((ulong)bVar1 & 0x7f) << ((byte)local_34 & 0x3f) | local_30;
    local_34 = local_34 + 7;
  } while( true );
}

Assistant:

const char* GetVarint64Ptr(const char* p, const char* limit, uint64_t* value) {
  uint64_t result = 0;
  for (uint32_t shift = 0; shift <= 63 && p < limit; shift += 7) {
    uint64_t byte = *(reinterpret_cast<const uint8_t*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}